

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# precalc_lcp_common.cpp
# Opt level: O1

pair<unsigned_long,_unsigned_long> experiment<lcp64_experiment>(lcp64_experiment exp)

{
  unsigned_long uVar1;
  undefined8 uVar2;
  const_iterator __position;
  const_iterator cVar3;
  const_iterator __begin0;
  unsigned_long uVar4;
  long lVar5;
  pointer puVar6;
  const_iterator __end0;
  ulong uVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  ulong uVar8;
  unsigned_long *val;
  unsigned_long *puVar9;
  ulong uVar10;
  long lVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 in_XMM4 [16];
  pair<unsigned_long,_unsigned_long> pVar20;
  vector<unsigned_long,_std::allocator<unsigned_long>_> times;
  ulong in_stack_00000018;
  vector<unsigned_long,_std::allocator<unsigned_long>_> res;
  uint64_t timespan;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  value_type_conflict local_38;
  
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  uVar8 = 0;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  uVar12 = 0;
  do {
    if (uVar8 == 500) break;
    local_38 = 0;
    if (local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                (&local_58,
                 (iterator)
                 local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_38);
    }
    else {
      *local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish = 0;
      local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    uVar4 = (*(code *)*res.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                       .super__Vector_impl_data._M_start)
                      (*times.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish,
                       *times.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,in_stack_00000018 >> 3);
    local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish[-1] = uVar4;
    lVar11 = 1000;
    lVar5 = std::chrono::_V2::system_clock::now();
    do {
      DoNotOptimizeAway<lcp64_experiment&>
                ((lcp64_experiment *)
                 &times.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish);
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
    lVar11 = std::chrono::_V2::system_clock::now();
    local_38 = lVar11 - lVar5;
    uVar10 = (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    cVar3._M_current =
         local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    while (__position._M_current = cVar3._M_current, 0 < (long)uVar10) {
      uVar7 = uVar10 >> 1;
      uVar10 = ~uVar7 + uVar10;
      cVar3._M_current = __position._M_current + uVar7 + 1;
      if (local_38 < (__position._M_current + uVar7 + 1)[-1]) {
        uVar10 = uVar7;
        cVar3._M_current = __position._M_current;
      }
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::insert
              (&local_78,__position,&local_38);
    uVar8 = uVar8 + 1;
    if ((uVar8 & 3) == 0) {
      local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
      puVar9 = local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
      if (puVar9 != local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
        memmove(local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start,puVar9,
                (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar9);
      }
      local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
    }
    uVar10 = (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    if (uVar10 < 0x33) {
LAB_00105852:
      auVar13 = SUB6416(ZEXT864(0),0) << 0x40;
      dVar17 = 0.0;
      for (puVar9 = local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          puVar9 != local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish; puVar9 = puVar9 + 1) {
        auVar14 = vcvtusi2sd_avx512f(in_XMM4,*puVar9);
        dVar17 = dVar17 + auVar14._0_8_;
      }
      auVar14 = vcvtusi2sd_avx512f(in_XMM4,uVar10);
      if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        auVar16 = ZEXT864(0) << 0x40;
        puVar6 = local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          auVar13 = vcvtusi2sd_avx512f(in_XMM4,*puVar6);
          auVar19._8_8_ = 0;
          auVar19._0_8_ = auVar13._0_8_ - dVar17 / auVar14._0_8_;
          auVar13 = vfmadd231sd_fma(auVar16._0_16_,auVar19,auVar19);
          auVar16 = ZEXT1664(auVar13);
          puVar6 = puVar6 + 1;
        } while (puVar6 != local_78.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish);
      }
      auVar15._0_8_ = auVar13._0_8_ / auVar14._0_8_;
      auVar15._8_8_ = auVar13._8_8_;
      uVar12 = vcvttsd2usi_avx512f(auVar15);
      uVar7 = 1;
    }
    else {
      auVar13 = SUB6416(ZEXT864(0),0) << 0x40;
      dVar17 = 0.0;
      for (puVar9 = local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          puVar9 != local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish; puVar9 = puVar9 + 1) {
        auVar14 = vcvtusi2sd_avx512f(in_XMM4,*puVar9);
        dVar17 = dVar17 + auVar14._0_8_;
      }
      auVar14 = vcvtusi2sd_avx512f(in_XMM4,uVar10);
      if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        auVar16 = ZEXT864(0) << 0x40;
        puVar6 = local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          auVar13 = vcvtusi2sd_avx512f(in_XMM4,*puVar6);
          auVar18._8_8_ = 0;
          auVar18._0_8_ = auVar13._0_8_ - dVar17 / auVar14._0_8_;
          auVar13 = vfmadd231sd_fma(auVar16._0_16_,auVar18,auVar18);
          auVar16 = ZEXT1664(auVar13);
          puVar6 = puVar6 + 1;
        } while (puVar6 != local_78.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish);
      }
      auVar14._0_8_ = auVar13._0_8_ / auVar14._0_8_;
      auVar14._8_8_ = auVar13._8_8_;
      auVar13 = vcvtusi2sd_avx512f(in_XMM4,uVar12);
      uVar2 = vcmppd_avx512vl(auVar14,ZEXT816(0x4024000000000000),5);
      uVar7 = vcmppd_avx512vl(auVar14,auVar13,5);
      uVar7 = ((byte)uVar2 & 3) & uVar7;
      if ((10.0 <= auVar14._0_8_) && (auVar13._0_8_ <= auVar14._0_8_)) goto LAB_00105852;
    }
  } while ((uVar7 & 1) != 0);
  uVar4 = *local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish[-1];
  if (local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pVar20.second = uVar1;
  pVar20.first = uVar4;
  return pVar20;
}

Assistant:

std::pair<size_t,size_t> experiment(experiment_type exp) {

    std::vector<uint64_t> times;
    std::vector<uint64_t> res;
    uint64_t prev_deviation = 0;

    for(size_t i = 0; i < MAX_SAMPLES; ++i) {
      res.push_back(0);

      res.back() = exp();

      using time_point = std::chrono::high_resolution_clock::time_point;
      time_point t1 = std::chrono::high_resolution_clock::now();

      for(size_t j = 0; j < MEASUREMENTS; ++j) {
	DoNotOptimizeAway(exp);
      }

      time_point t2 = std::chrono::high_resolution_clock::now();

      const uint64_t timespan = std::chrono::duration_cast<std::chrono::nanoseconds>(t2 - t1).count();

      times.insert(std::upper_bound(times.begin(), times.end(), timespan), timespan);

      if( (i+1) % 4 == 0) {
	times.pop_back();
	times.erase(times.begin());
      }
      if(times.size() > MIN_SAMPLES) {
	double deviation = packed::math::deviation(times, packed::math::arithmetic_mean(times));
	if(deviation < MIN_DEVIATION) break;
	if(prev_deviation > deviation) break;
      }
      prev_deviation = packed::math::deviation(times, packed::math::arithmetic_mean(times));
    }
    // std::cout << "len " << length << " means " << math::arithmetic_mean(times) << " dev: " << math::deviation(times, math::arithmetic_mean(times)) << "LCE " << res.back() << std::endl;
    return std::make_pair(times[0], times.back());
}